

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqlite_class.cpp
# Opt level: O2

void __thiscall test_cpp_db_sqlite::test_execute::test_method(test_execute *this)

{
  connection *pcVar1;
  string *psVar2;
  bool bVar3;
  long lVar4;
  int column;
  result *this_00;
  unit_test_log_t *puVar5;
  string *psVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  value vVar8;
  undefined1 local_2b8 [16];
  undefined1 *local_2a8;
  char *local_2a0;
  string local_298;
  allocator<char> local_271;
  undefined1 local_270 [24];
  undefined4 local_258;
  int local_254;
  result r;
  int64_t sum;
  string names;
  long local_220;
  undefined4 local_214;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  const_string local_1d0;
  const_string local_1c0 [4];
  const_string local_180;
  const_string local_170;
  const_string local_160;
  const_string local_150;
  const_string local_140 [4];
  const_string local_100;
  const_string local_f0;
  const_string local_e0;
  const_string local_d0;
  const_string local_c0;
  char *local_b0;
  char *local_a8;
  const_string local_a0;
  const_string local_90;
  char *local_80;
  char *local_78;
  const_string local_70;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_40,0x92,&local_50);
  names._M_string_length = names._M_string_length & 0xffffffffffffff00;
  names._M_dataplus._M_p = ">h\x15";
  names.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  names.field_2._8_8_ = (long)"\t" + 1;
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_1d8 = "";
  pcVar1 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).con.
           super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_270._16_8_ = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2b8,"select count(*) from TEST_TABLE",(allocator<char> *)&sum);
  cpp_db::execute_scalar<>((cpp_db *)&local_298,pcVar1,(string *)local_2b8);
  local_270._0_8_ = cpp_db::numeric_extractor<long>((value *)&local_298);
  r.result_impl._M_t.
  super___uniq_ptr_impl<cpp_db::result_interface,_std::default_delete<cpp_db::result_interface>_>.
  _M_t.
  super__Tuple_impl<0UL,_cpp_db::result_interface_*,_std::default_delete<cpp_db::result_interface>_>
  .super__Head_base<0UL,_cpp_db::result_interface_*,_false>._M_head_impl._0_4_ = 3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (&names,&local_1e0,0x92,1,2,local_270,
             "cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, \"select count(*) from TEST_TABLE\"))"
             ,&r,"3");
  std::any::reset((any *)&local_298);
  std::__cxx11::string::~string((string *)local_2b8);
  psVar2 = (string *)
           (((BOOST_AUTO_TEST_CASE_FIXTURE *)local_270._16_8_)->con).
           super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&names,"select * from TEST_TABLE where COL1 in (?, ?)",
             (allocator<char> *)local_270);
  local_2b8._0_4_ = 1;
  local_298._M_dataplus._M_p._0_4_ = 2;
  cpp_db::execute<int,int>((connection *)&r,psVar2,(int *)&names,(int *)local_2b8);
  std::__cxx11::string::~string((string *)&names);
  sum = 0;
  names._M_dataplus._M_p = (pointer)&names.field_2;
  names._M_string_length = 0;
  names.field_2._M_allocated_capacity = names.field_2._M_allocated_capacity & 0xffffffffffffff00;
  while( true ) {
    this_00 = &r;
    bVar3 = cpp_db::result::is_eof(&r);
    if (bVar3) break;
    column = (int)&r;
    cpp_db::result::get_column_value((result *)local_2b8,column);
    lVar4 = cpp_db::numeric_extractor<long>((value *)local_2b8);
    sum = sum + lVar4;
    std::any::reset((any *)local_2b8);
    vVar8 = cpp_db::result::get_column_value((result *)&local_298,column);
    cpp_db::value_of<std::__cxx11::string>
              ((string *)local_2b8,(cpp_db *)&local_298,(value *)vVar8._M_storage._M_ptr);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&names,(string *)local_2b8);
    std::__cxx11::string::~string((string *)local_2b8);
    std::any::reset((any *)&local_298);
    cpp_db::result::move_next(&r);
  }
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_60.m_end = "";
  local_70.m_begin = "";
  local_70.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_60,0x9c,&local_70);
  puVar5 = (unit_test_log_t *)local_2b8;
  local_2b8[8] = false;
  local_2b8._0_8_ = &PTR__lazy_ostream_00191f60;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = (char *)((long)"\t" + 1);
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_78 = "";
  local_298._M_dataplus._M_p._0_4_ = 3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (puVar5,&local_80,0x9c,1,2,&sum,"sum",&local_298,"3");
  local_90.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_90.m_end = "";
  local_a0.m_begin = "";
  local_a0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar5,&local_90,0x9d,&local_a0);
  puVar5 = (unit_test_log_t *)local_2b8;
  local_2b8[8] = false;
  local_2b8._0_8_ = &PTR__lazy_ostream_00191f60;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = (char *)((long)"\t" + 1);
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_a8 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[12]>
            (puVar5,&local_b0,0x9d,1,2,&names,"names","firstsecond","\"firstsecond\"");
  local_c0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_c0.m_end = "";
  local_d0.m_begin = "";
  local_d0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar5,&local_c0,0x9f,&local_d0);
  local_2b8[8] = false;
  local_2b8._0_8_ = &PTR__lazy_ostream_00191f60;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = (char *)((long)"\t" + 1);
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_1e8 = "";
  psVar2 = (string *)
           (((BOOST_AUTO_TEST_CASE_FIXTURE *)local_270._16_8_)->con).
           super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,
             "select count(*) from TEST_TABLE where COL1 in (?, ?) and COL2 in (?, ?)",&local_271);
  local_254 = 1;
  local_258._0_1_ = '\x02';
  local_258._1_1_ = '\0';
  local_258._2_1_ = '\0';
  local_258._3_1_ = '\0';
  cpp_db::execute_scalar<int,int,char_const(&)[6],char_const(&)[7]>
            ((connection *)local_270,psVar2,(int *)&local_298,&local_254,(char (*) [6])&local_258,
             (char (*) [7])"first");
  local_220 = cpp_db::numeric_extractor<long>((value *)local_270);
  local_214 = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_2b8,&local_1f0,0x9f,1,2,&local_220,
             "cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, \"select count(*) from TEST_TABLE where COL1 in (?, ?) and COL2 in (?, ?)\", 1, 2, \"first\", \"second\"))"
             ,&local_214,"2");
  std::any::reset((any *)local_270);
  std::__cxx11::string::~string((string *)&local_298);
  pcVar1 = (((BOOST_AUTO_TEST_CASE_FIXTURE *)local_270._16_8_)->con).
           super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2b8,"delete from TEST_TABLE where COL1 = ?",
             (allocator<char> *)local_270);
  local_298._M_dataplus._M_p._0_4_ = 1;
  cpp_db::execute_non_query<int>(pcVar1,(string *)local_2b8,(int *)&local_298);
  psVar6 = (string *)local_2b8;
  std::__cxx11::string::~string(psVar6);
  local_e0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_e0.m_end = "";
  local_f0.m_begin = "";
  local_f0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar6,&local_e0,0xa0,&local_f0);
  local_298._M_dataplus._M_p._0_1_ = 1;
  local_298._M_string_length = 0;
  local_298.field_2._M_allocated_capacity = 0;
  local_2b8[8] = false;
  local_2b8._0_8_ = &PTR__lazy_ostream_00192620;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "no exceptions thrown by cpp_db::execute_non_query(*con, \"delete from TEST_TABLE where COL1 = ?\", 1)"
  ;
  local_100.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_100.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_298,(lazy_ostream *)local_2b8,&local_100,0xa0,CHECK,
             CHECK_MSG,0);
  paVar7 = &local_298.field_2;
  boost::detail::shared_count::~shared_count((shared_count *)&paVar7->_M_allocated_capacity);
  local_140[0].m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_140[0].m_end = "";
  local_150.m_begin = "";
  local_150.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)&paVar7->_M_allocated_capacity,local_140,0xa1,&local_150);
  local_2b8[8] = false;
  local_2b8._0_8_ = &PTR__lazy_ostream_00191f60;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = (char *)((long)"\t" + 1);
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_1f8 = "";
  pcVar1 = (((BOOST_AUTO_TEST_CASE_FIXTURE *)local_270._16_8_)->con).
           super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"select count(*) from TEST_TABLE",(allocator<char> *)&local_258);
  cpp_db::execute_scalar<>((cpp_db *)local_270,pcVar1,&local_298);
  local_220 = cpp_db::numeric_extractor<long>((value *)local_270);
  local_254 = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_2b8,&local_200,0xa1,1,2,&local_220,
             "cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, \"select count(*) from TEST_TABLE\"))"
             ,&local_254,"2");
  std::any::reset((any *)local_270);
  std::__cxx11::string::~string((string *)&local_298);
  pcVar1 = (((BOOST_AUTO_TEST_CASE_FIXTURE *)local_270._16_8_)->con).
           super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2b8,"delete from TEST_TABLE",(allocator<char> *)&local_298);
  cpp_db::execute_non_query<>(pcVar1,(string *)local_2b8);
  psVar6 = (string *)local_2b8;
  std::__cxx11::string::~string(psVar6);
  local_160.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_160.m_end = "";
  local_170.m_begin = "";
  local_170.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar6,&local_160,0xa2,&local_170);
  local_298._M_dataplus._M_p._0_4_ = CONCAT31(local_298._M_dataplus._M_p._1_3_,1);
  local_298._M_string_length = 0;
  local_298.field_2._M_allocated_capacity = 0;
  local_2b8[8] = false;
  local_2b8._0_8_ = &PTR__lazy_ostream_00191de0;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = "no exceptions thrown by cpp_db::execute_non_query(*con, \"delete from TEST_TABLE\")";
  local_180.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_180.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_298,(lazy_ostream *)local_2b8,&local_180,0xa2,CHECK,
             CHECK_MSG,0);
  paVar7 = &local_298.field_2;
  boost::detail::shared_count::~shared_count((shared_count *)&paVar7->_M_allocated_capacity);
  local_1c0[0].m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_1c0[0].m_end = "";
  local_1d0.m_begin = "";
  local_1d0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)&paVar7->_M_allocated_capacity,local_1c0,0xa3,&local_1d0);
  local_2b8[8] = false;
  local_2b8._0_8_ = &PTR__lazy_ostream_00191f60;
  local_2a8 = boost::unit_test::lazy_ostream::inst;
  local_2a0 = (char *)((long)"\t" + 1);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_208 = "";
  pcVar1 = (((BOOST_AUTO_TEST_CASE_FIXTURE *)local_270._16_8_)->con).
           super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"select count(*) from TEST_TABLE",(allocator<char> *)&local_258);
  cpp_db::execute_scalar<>((cpp_db *)local_270,pcVar1,&local_298);
  local_220 = cpp_db::numeric_extractor<long>((value *)local_270);
  local_254 = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
            (local_2b8,&local_210,0xa3,1,2,&local_220,
             "cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, \"select count(*) from TEST_TABLE\"))"
             ,&local_254,"0");
  std::any::reset((any *)local_270);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&names);
  cpp_db::result::~result(&r);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_execute)
{
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, "select count(*) from TEST_TABLE")), 3);
    cpp_db::result r = cpp_db::execute(*con, "select * from TEST_TABLE where COL1 in (?, ?)", 1, 2);
    int64_t sum = 0;
    std::string names;
    while(!r.is_eof())
    {
        sum += cpp_db::value_of<int64_t>(r.get_column_value(0));
        names.append(cpp_db::value_of<std::string>(r.get_column_value(1)));
        r.move_next();
    }
    BOOST_CHECK_EQUAL(sum, 3);
    BOOST_CHECK_EQUAL(names, "firstsecond");

    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, "select count(*) from TEST_TABLE where COL1 in (?, ?) and COL2 in (?, ?)", 1, 2, "first", "second")), 2);
    BOOST_CHECK_NO_THROW(cpp_db::execute_non_query(*con, "delete from TEST_TABLE where COL1 = ?", 1));
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, "select count(*) from TEST_TABLE")), 2);
    BOOST_CHECK_NO_THROW(cpp_db::execute_non_query(*con, "delete from TEST_TABLE"));
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(cpp_db::execute_scalar(*con, "select count(*) from TEST_TABLE")), 0);
}